

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNErrCode
SUNMemoryHelper_Alloc
          (SUNMemoryHelper helper,SUNMemory *memptr,size_t mem_size,SUNMemoryType mem_type,
          void *queue)

{
  SUNErrCode SVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SUNContext sunctx_local_scope_;
  SUNErrCode ier;
  
  SVar1 = (*(code *)**(undefined8 **)(in_RDI + 8))
                    (in_RDI,in_RSI,in_RDX,in_ECX,in_R8,in_R9,*(undefined8 *)(in_RDI + 0x10));
  return SVar1;
}

Assistant:

SUNErrCode SUNMemoryHelper_Alloc(SUNMemoryHelper helper, SUNMemory* memptr,
                                 size_t mem_size, SUNMemoryType mem_type,
                                 void* queue)
{
  SUNErrCode ier = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(helper->ops->alloc, SUN_ERR_NOT_IMPLEMENTED);
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  ier = helper->ops->alloc(helper, memptr, mem_size, mem_type, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return ier;
}